

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

void __thiscall
tchecker::system::system_builder_t::visit(system_builder_t *this,int_declaration_t *d)

{
  intvar_id_t size;
  integer_t min;
  integer_t max;
  integer_t initial;
  system_t *this_00;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  local_68;
  
  this_00 = this->_system;
  size = d->_size;
  min = d->_min;
  max = d->_max;
  initial = d->_init;
  attributes_t::attributes_t
            ((attributes_t *)&local_68,&(d->super_inner_declaration_t).super_declaration_t._attr);
  system_t::add_intvar(this_00,&d->_name,size,min,max,initial,(attributes_t *)&local_68);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

virtual void visit(tchecker::parsing::int_declaration_t const & d)
  {
    if (std::numeric_limits<tchecker::intvar_id_t>::max() < d.size())
      throw std::out_of_range("integer variable size cannot be represented");
    tchecker::intvar_id_t size = d.size();
    _system.add_intvar(d.name(), size, d.min(), d.max(), d.init(), d.attributes());
  }